

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

BiDirectionalLSTMLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BiDirectionalLSTMLayerParams>
          (Arena *arena)

{
  BiDirectionalLSTMLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (BiDirectionalLSTMLayerParams *)operator_new(0x78);
    CoreML::Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (BiDirectionalLSTMLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x78,
                      (type_info *)&CoreML::Specification::BiDirectionalLSTMLayerParams::typeinfo);
    CoreML::Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }